

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O3

int __thiscall tt::net::Epoll::poll(Epoll *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int events_num;
  
  while( true ) {
    events_num = epoll_wait(__fds->fd,(epoll_event *)__fds[1],
                            (int)((ulong)((long)__fds[2] - (long)__fds[1]) >> 2) * -0x55555555,10000
                           );
    if (events_num < 0) {
      perror("epoll wait error");
    }
    getEventsRequest((vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
                      *)this,(Epoll *)__fds,events_num);
    if ((this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
        super__Vector_impl_data._M_start != *(pointer *)this) break;
    std::
    vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>::
    ~vector((vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
             *)this);
  }
  return (int)this;
}

Assistant:

std::vector<SP_Channel> Epoll::poll(){
	
	while(true){
		
		int event_count = 
			epoll_wait(m_epollFd, &*m_events.begin(),m_events.size(), EPOLLWAIT_TIME);
	
		if(event_count < 0) perror("epoll wait error");

		std::vector<SP_Channel> req_data = getEventsRequest(event_count);

		if(req_data.size() > 0) return req_data;
	}
}